

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O1

bool __thiscall
chrono::geometry::ChTriangleMeshConnected::ComputeNeighbouringTriangleMap
          (ChTriangleMeshConnected *this,
          vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *tri_map)

{
  int iVar1;
  int iVar2;
  _Base_ptr p_Var3;
  pointer paVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  pointer pCVar9;
  size_type sVar10;
  _Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_> _Var11;
  ulong uVar12;
  _Base_ptr p_Var13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  size_type __new_size;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>_>
  pVar18;
  pair<int,_int> medgeA;
  pair<int,_int> medgeB;
  pair<int,_int> medgeC;
  multimap<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  edge_map;
  pair<const_std::pair<int,_int>,_int> local_90;
  key_type local_80;
  key_type local_78;
  ChTriangleMeshConnected *local_70;
  undefined8 local_68;
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar9 = (this->m_face_v_indices).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_70 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->m_face_v_indices).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pCVar9) {
    __new_size = 0;
  }
  else {
    uVar16 = 0;
    do {
      iVar1 = pCVar9[uVar16].m_data[0];
      iVar2 = pCVar9[uVar16].m_data[1];
      iVar15 = pCVar9[uVar16].m_data[2];
      iVar5 = iVar2;
      if (iVar1 < iVar2) {
        iVar5 = iVar1;
      }
      iVar6 = iVar2;
      if (iVar2 < iVar1) {
        iVar6 = iVar1;
      }
      iVar7 = iVar15;
      if (iVar2 < iVar15) {
        iVar7 = iVar2;
      }
      if (iVar2 <= iVar15) {
        iVar2 = iVar15;
      }
      iVar8 = iVar1;
      if (iVar15 < iVar1) {
        iVar8 = iVar15;
      }
      if (iVar1 < iVar15) {
        iVar1 = iVar15;
      }
      local_90.first.second = iVar6;
      local_90.first.first = iVar5;
      iVar15 = (int)uVar16;
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
        p_Var13 = &local_60._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        do {
          p_Var13 = p_Var3;
          lVar17 = 0x10;
          if (((int)p_Var13[1]._M_color <= iVar5) &&
             (((int)p_Var13[1]._M_color < iVar5 || (*(int *)&p_Var13[1].field_0x4 <= iVar6)))) {
            lVar17 = 0x18;
          }
          p_Var3 = *(_Base_ptr *)((long)&p_Var13->_M_color + lVar17);
        } while (p_Var3 != (_Base_ptr)0x0);
      }
      local_80 = (key_type)&local_60;
      local_90.second = iVar15;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
      ::
      _M_insert_<std::pair<std::pair<int,int>const,int>,std::_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>::_Alloc_node>
                ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                  *)local_80,(_Base_ptr)0x0,p_Var13,&local_90,(_Alloc_node *)&local_80);
      local_90.first.second = iVar2;
      local_90.first.first = iVar7;
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
        p_Var13 = &local_60._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        do {
          p_Var13 = p_Var3;
          lVar17 = 0x10;
          if (((int)p_Var13[1]._M_color <= iVar7) &&
             (((int)p_Var13[1]._M_color < iVar7 || (*(int *)&p_Var13[1].field_0x4 <= iVar2)))) {
            lVar17 = 0x18;
          }
          p_Var3 = *(_Base_ptr *)((long)&p_Var13->_M_color + lVar17);
        } while (p_Var3 != (_Base_ptr)0x0);
      }
      local_80 = (key_type)&local_60;
      local_90.second = iVar15;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
      ::
      _M_insert_<std::pair<std::pair<int,int>const,int>,std::_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>::_Alloc_node>
                ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                  *)local_80,(_Base_ptr)0x0,p_Var13,&local_90,(_Alloc_node *)&local_80);
      local_90.first.second = iVar1;
      local_90.first.first = iVar8;
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
        p_Var13 = &local_60._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        do {
          p_Var13 = p_Var3;
          lVar17 = 0x10;
          if (((int)p_Var13[1]._M_color <= iVar8) &&
             (((int)p_Var13[1]._M_color < iVar8 || (*(int *)&p_Var13[1].field_0x4 <= iVar1)))) {
            lVar17 = 0x18;
          }
          p_Var3 = *(_Base_ptr *)((long)&p_Var13->_M_color + lVar17);
        } while (p_Var3 != (_Base_ptr)0x0);
      }
      local_80 = (key_type)&local_60;
      local_90.second = iVar15;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
      ::
      _M_insert_<std::pair<std::pair<int,int>const,int>,std::_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>::_Alloc_node>
                ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                  *)local_80,(_Base_ptr)0x0,p_Var13,&local_90,(_Alloc_node *)&local_80);
      uVar16 = uVar16 + 1;
      pCVar9 = (local_70->m_face_v_indices).
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __new_size = ((long)(local_70->m_face_v_indices).
                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar9 >> 2) *
                   -0x5555555555555555;
    } while (uVar16 <= __new_size && __new_size - uVar16 != 0);
  }
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::resize
            (tri_map,__new_size);
  pCVar9 = (local_70->m_face_v_indices).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((local_70->m_face_v_indices).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pCVar9) {
    bVar14 = 0;
  }
  else {
    uVar16 = 0;
    local_68 = 0;
    do {
      paVar4 = (tri_map->
               super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      paVar4[uVar16]._M_elems[0] = (int)uVar16;
      paVar4[uVar16]._M_elems[1] = -1;
      paVar4[uVar16]._M_elems[2] = -1;
      paVar4[uVar16]._M_elems[3] = -1;
      local_90.first.first = pCVar9[uVar16].m_data[0];
      iVar1 = pCVar9[uVar16].m_data[1];
      local_90.first.second = iVar1;
      local_80.first = pCVar9[uVar16].m_data[1];
      iVar2 = pCVar9[uVar16].m_data[2];
      local_80.second = iVar2;
      iVar15 = pCVar9[uVar16].m_data[2];
      local_78.second = pCVar9[uVar16].m_data[0];
      if (iVar1 < local_90.first.first) {
        local_90.first.second = local_90.first.first;
        local_90.first.first = iVar1;
      }
      if (iVar2 < local_80.first) {
        local_80.second = local_80.first;
        local_80.first = iVar2;
      }
      local_78.first = iVar15;
      if (local_78.second < iVar15) {
        local_78.first = local_78.second;
        local_78.second = iVar15;
      }
      sVar10 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::count(&local_60,&local_90.first);
      if (((2 < sVar10) ||
          (sVar10 = std::
                    _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                    ::count(&local_60,&local_80), 2 < sVar10)) ||
         (sVar10 = std::
                   _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                   ::count(&local_60,&local_78), 2 < sVar10)) {
        local_68 = CONCAT71((int7)(sVar10 >> 8),1);
      }
      pVar18 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::equal_range(&local_60,&local_90.first);
      for (_Var11 = pVar18.first._M_node; _Var11._M_node != pVar18.second._M_node._M_node;
          _Var11._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var11._M_node)) {
        if (uVar16 != *(uint *)&_Var11._M_node[1]._M_parent) {
          (tri_map->super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
          )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_elems[1] =
               *(uint *)&_Var11._M_node[1]._M_parent;
          break;
        }
      }
      pVar18 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::equal_range(&local_60,&local_80);
      for (_Var11 = pVar18.first._M_node; _Var11._M_node != pVar18.second._M_node._M_node;
          _Var11._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var11._M_node)) {
        if (uVar16 != *(uint *)&_Var11._M_node[1]._M_parent) {
          (tri_map->super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
          )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_elems[2] =
               *(uint *)&_Var11._M_node[1]._M_parent;
          break;
        }
      }
      pVar18 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::equal_range(&local_60,&local_78);
      for (_Var11 = pVar18.first._M_node; _Var11._M_node != pVar18.second._M_node._M_node;
          _Var11._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var11._M_node)) {
        if (uVar16 != *(uint *)&_Var11._M_node[1]._M_parent) {
          (tri_map->super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
          )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_elems[3] =
               *(uint *)&_Var11._M_node[1]._M_parent;
          break;
        }
      }
      uVar16 = uVar16 + 1;
      pCVar9 = (local_70->m_face_v_indices).
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar12 = ((long)(local_70->m_face_v_indices).
                      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar9 >> 2) *
               -0x5555555555555555;
    } while (uVar16 <= uVar12 && uVar12 - uVar16 != 0);
    bVar14 = (byte)local_68;
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return (bool)(bVar14 & 1);
}

Assistant:

bool ChTriangleMeshConnected::ComputeNeighbouringTriangleMap(std::vector<std::array<int, 4>>& tri_map) const {
    bool pathological_edges = false;

    std::multimap<std::pair<int, int>, int> edge_map;

    for (int it = 0; it < this->m_face_v_indices.size(); ++it) {
        // edges = pairs of vertexes indexes
        std::pair<int, int> medgeA(this->m_face_v_indices[it].x(), this->m_face_v_indices[it].y());
        std::pair<int, int> medgeB(this->m_face_v_indices[it].y(), this->m_face_v_indices[it].z());
        std::pair<int, int> medgeC(this->m_face_v_indices[it].z(), this->m_face_v_indices[it].x());
        // vertex indexes in edges: always in increasing order to avoid ambiguous duplicated edges
        if (medgeA.first > medgeA.second)
            medgeA = std::pair<int, int>(medgeA.second, medgeA.first);
        if (medgeB.first > medgeB.second)
            medgeB = std::pair<int, int>(medgeB.second, medgeB.first);
        if (medgeC.first > medgeC.second)
            medgeC = std::pair<int, int>(medgeC.second, medgeC.first);
        edge_map.insert({medgeA, it});
        edge_map.insert({medgeB, it});
        edge_map.insert({medgeC, it});
    }

    // Create a map of neighboring triangles, vector of:
    // [Ti TieA TieB TieC]
    tri_map.resize(this->m_face_v_indices.size());
    for (int it = 0; it < this->m_face_v_indices.size(); ++it) {
        tri_map[it][0] = it;
        tri_map[it][1] = -1;  // default no neighbour
        tri_map[it][2] = -1;  // default no neighbour
        tri_map[it][3] = -1;  // default no neighbour
        // edges = pairs of vertexes indexes
        std::pair<int, int> medgeA(this->m_face_v_indices[it].x(), this->m_face_v_indices[it].y());
        std::pair<int, int> medgeB(this->m_face_v_indices[it].y(), this->m_face_v_indices[it].z());
        std::pair<int, int> medgeC(this->m_face_v_indices[it].z(), this->m_face_v_indices[it].x());
        // vertex indexes in edges: always in increasing order to avoid ambiguous duplicated edges
        if (medgeA.first > medgeA.second)
            medgeA = std::pair<int, int>(medgeA.second, medgeA.first);
        if (medgeB.first > medgeB.second)
            medgeB = std::pair<int, int>(medgeB.second, medgeB.first);
        if (medgeC.first > medgeC.second)
            medgeC = std::pair<int, int>(medgeC.second, medgeC.first);
        if (edge_map.count(medgeA) > 2 || edge_map.count(medgeB) > 2 || edge_map.count(medgeC) > 2) {
            pathological_edges = true;
            // GetLog() << "Warning, edge shared with more than two triangles! \n";
        }
        auto retA = edge_map.equal_range(medgeA);
        for (auto fedge = retA.first; fedge != retA.second; ++fedge) {
            if (fedge->second != it) {
                tri_map[it][1] = fedge->second;
                break;
            }
        }
        auto retB = edge_map.equal_range(medgeB);
        for (auto fedge = retB.first; fedge != retB.second; ++fedge) {
            if (fedge->second != it) {
                tri_map[it][2] = fedge->second;
                break;
            }
        }
        auto retC = edge_map.equal_range(medgeC);
        for (auto fedge = retC.first; fedge != retC.second; ++fedge) {
            if (fedge->second != it) {
                tri_map[it][3] = fedge->second;
                break;
            }
        }
    }
    return pathological_edges;
}